

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O2

void ZiAllocScratchs(hs_database_t *db,hs_scratch_t **sc,int sc_len,char *info)

{
  int iVar1;
  ostream *poVar2;
  hs_scratch_t **pphVar3;
  char *pcVar4;
  long lVar5;
  
  *sc = (hs_scratch_t *)0x0;
  iVar1 = hs_alloc_scratch();
  if (iVar1 == 0) {
    lVar5 = 0;
    pphVar3 = sc + 1;
    do {
      lVar5 = lVar5 + 1;
      if (sc_len <= lVar5) {
        return;
      }
      iVar1 = hs_clone_scratch(*sc,pphVar3);
      pphVar3 = pphVar3 + 1;
    } while (iVar1 == 0);
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] ");
    poVar2 = std::operator<<(poVar2,info);
    pcVar4 = " HS-Clone Failed: ";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ ERROR ] ");
    poVar2 = std::operator<<(poVar2,info);
    pcVar4 = " HS-Alloc Failed: ";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

void ZiAllocScratchs(const hs_database_t* db, hs_scratch_t** sc, int sc_len,
    const char* info)
{
    hs_error_t err;

    sc[0] = nullptr;
    err = hs_alloc_scratch(db, &sc[0]);
    if (err != HS_SUCCESS)
    {
        cerr << "[ ERROR ] " << info << " HS-Alloc Failed: " << err << endl;
        exit(-1);
    }

    for (int i = 1; i < sc_len; i++)
    {
        err = hs_clone_scratch(sc[0], &sc[i]);
        if (err != HS_SUCCESS)
        {
            cerr << "[ ERROR ] " << info << " HS-Clone Failed: " << err << endl;
            exit(-1);
        }
    }
}